

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionPointer
          (ExpressionContext *ctx,SynBase *source,ExprFunctionDefinition *definition,
          bool hideFunction)

{
  FunctionData *function;
  TypeFunction *pTVar1;
  Allocator *allocator;
  ExprFunctionAccess *this;
  SynBase *source_00;
  SynBase *source_01;
  ExprBase *context;
  ExprSequence *this_00;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase*> local_90 [16];
  ExprFunctionAccess *local_80;
  ExprVariableDefinition *local_78 [3];
  ExprFunctionDefinition *local_60;
  undefined1 local_58 [8];
  SmallArray<ExprBase_*,_3U> expressions;
  bool hideFunction_local;
  ExprFunctionDefinition *definition_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  expressions.allocator._7_1_ = hideFunction;
  if (hideFunction) {
    ExpressionContext::HideFunction(ctx,definition->function);
    definition->function->isHidden = true;
  }
  SmallArray<ExprBase_*,_3U>::SmallArray((SmallArray<ExprBase_*,_3U> *)local_58,ctx->allocator);
  local_60 = definition;
  SmallArray<ExprBase_*,_3U>::push_back
            ((SmallArray<ExprBase_*,_3U> *)local_58,(ExprBase **)&local_60);
  if (definition->contextVariableDefinition != (ExprVariableDefinition *)0x0) {
    local_78[0] = definition->contextVariableDefinition;
    SmallArray<ExprBase_*,_3U>::push_back
              ((SmallArray<ExprBase_*,_3U> *)local_58,(ExprBase **)local_78);
  }
  this = ExpressionContext::get<ExprFunctionAccess>(ctx);
  source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  function = definition->function;
  pTVar1 = function->type;
  source_01 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  context = CreateFunctionContextAccess(ctx,source_01,definition->function);
  ExprFunctionAccess::ExprFunctionAccess(this,source_00,&pTVar1->super_TypeBase,function,context);
  local_80 = this;
  SmallArray<ExprBase_*,_3U>::push_back
            ((SmallArray<ExprBase_*,_3U> *)local_58,(ExprBase **)&local_80);
  this_00 = ExpressionContext::get<ExprSequence>(ctx);
  allocator = ctx->allocator;
  pTVar1 = definition->function->type;
  ArrayView<ExprBase*>::ArrayView<3u>(local_90,(SmallArray<ExprBase_*,_3U> *)local_58);
  arr._12_4_ = 0;
  arr._0_12_ = local_90._0_12_;
  ExprSequence::ExprSequence(this_00,allocator,source,&pTVar1->super_TypeBase,arr);
  SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_58);
  return &this_00->super_ExprBase;
}

Assistant:

ExprBase* CreateFunctionPointer(ExpressionContext &ctx, SynBase *source, ExprFunctionDefinition *definition, bool hideFunction)
{
	if(hideFunction)
	{
		ctx.HideFunction(definition->function);

		definition->function->isHidden = true;
	}

	SmallArray<ExprBase*, 3> expressions(ctx.allocator);

	expressions.push_back(definition);

	if(definition->contextVariableDefinition)
		expressions.push_back(definition->contextVariableDefinition);

	expressions.push_back(new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(ctx.MakeInternal(source), definition->function->type, definition->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function)));

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, definition->function->type, expressions);
}